

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

float Det3(Matrix_t sMatrix)

{
  float *arr;
  float *pfVar1;
  
  pfVar1 = sMatrix.pMatrix;
  if ((sMatrix._8_4_ & 0xffff) == 0x303) {
    return (((pfVar1[3] * pfVar1[2] * pfVar1[7] +
             *pfVar1 * pfVar1[4] * pfVar1[8] + pfVar1[1] * pfVar1[5] * pfVar1[6]) -
            pfVar1[5] * *pfVar1 * pfVar1[7]) - pfVar1[3] * pfVar1[1] * pfVar1[8]) -
           pfVar1[4] * pfVar1[2] * pfVar1[6];
  }
  puts("ERROR: Cannot calculate determinant, matrix must be a 4x4 square matrix!");
  return 0.0;
}

Assistant:

float Det3(Matrix_t sMatrix)
{
	float *arr = sMatrix.pMatrix;
	float sum = 0;

	if (sMatrix.row == 3 && sMatrix.column == 3)
	{
		sum = *(arr + 0 * 3 + 0) * *(arr + 1 * 3 + 1) * *(arr + 2 * 3 + 2) + *(arr + 0 * 3 + 1) * *(arr + 1 * 3 + 2) * *(arr + 2 * 3 + 0) + *(arr + 0 * 3 + 3) * *(arr + 1 * 2 + 0) * *(arr + 2 * 3 + 1) - *(arr + 0 * 3 + 0) * *(arr + 1 * 3 + 2) * *(arr + 2 * 3 + 1) - *(arr + 0 * 3 + 1) * *(arr + 1 * 3 + 0) * *(arr + 2 * 3 + 2) - *(arr + 0 * 3 + 2) * *(arr + 1 * 3 + 1) * *(arr + 2 * 3 + 0);
		return sum;
	}
	else
	{
		printf("ERROR: Cannot calculate determinant, matrix must be a 4x4 square matrix!\n");
		return 0;
	}
}